

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsIniKey>::copyAppend
          (QGenericArrayOps<QSettingsIniKey> *this,QSettingsIniKey *b,QSettingsIniKey *e)

{
  QSettingsIniKey *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QSettingsIniKey *in_RDI;
  QSettingsIniKey *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QSettingsIniKey>::begin
                        ((QArrayDataPointer<QSettingsIniKey> *)0x7d1917);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QSettingsIniKey::QSettingsIniKey(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->super_QString).d.size = (in_RDI->super_QString).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }